

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

opj_bool j2k_update_image_data(opj_tcd_v2_t *p_tcd,OPJ_BYTE *p_data,opj_image_t *p_output_image)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  opj_image_t *poVar6;
  opj_tcd_resolution_v2_t *poVar7;
  uint uVar8;
  OPJ_INT32 *pOVar9;
  uint *puVar10;
  OPJ_UINT32 OVar11;
  int iVar12;
  long lVar13;
  byte *pbVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  ushort *puVar20;
  OPJ_UINT32 OVar21;
  OPJ_UINT32 OVar22;
  uint uVar23;
  opj_tcd_tilecomp_v2_t *poVar24;
  int iVar25;
  uint uVar26;
  OPJ_UINT32 OVar27;
  opj_image_comp_t *poVar28;
  OPJ_UINT32 OVar29;
  int iVar30;
  opj_image_comp_t *poVar31;
  int local_5c;
  
  poVar6 = p_tcd->image;
  if (poVar6->numcomps != 0) {
    poVar31 = p_output_image->comps;
    poVar28 = poVar6->comps;
    poVar24 = p_tcd->tcd_image->tiles->comps;
    uVar8 = 0;
    do {
      if (poVar31->data == (OPJ_INT32 *)0x0) {
        pOVar9 = (OPJ_INT32 *)calloc((ulong)(poVar31->h * poVar31->w),4);
        poVar31->data = pOVar9;
        if (pOVar9 == (OPJ_INT32 *)0x0) {
          return 0;
        }
      }
      poVar31->resno_decoded = poVar28->resno_decoded;
      uVar18 = poVar28->resno_decoded;
      iVar19 = ((poVar28->prec >> 3) + 1) - (uint)((poVar28->prec & 7) == 0);
      if (iVar19 == 3) {
        iVar19 = 4;
      }
      poVar7 = poVar24->resolutions;
      uVar3 = poVar7[uVar18].x1;
      bVar1 = (byte)poVar31->factor;
      uVar4 = poVar7[uVar18].x0;
      iVar25 = (1 << (bVar1 & 0x1f)) + -1;
      uVar23 = (int)(poVar31->x0 + iVar25) >> (bVar1 & 0x1f);
      OVar21 = uVar3 - uVar4;
      uVar26 = (int)(iVar25 + poVar31->y0) >> (bVar1 & 0x1f);
      OVar22 = poVar31->w;
      uVar5 = uVar23 + OVar22;
      iVar25 = uVar23 - uVar4;
      if (uVar23 < uVar4) {
        local_5c = uVar4 - uVar23;
        iVar25 = 0;
        if (uVar5 < uVar3) {
          iVar17 = OVar21 - (uVar5 - uVar4);
          OVar11 = uVar5 - uVar4;
        }
        else {
          iVar17 = 0;
          OVar11 = OVar21;
        }
      }
      else {
        iVar17 = uVar3 - uVar5;
        if (uVar3 < uVar5 || iVar17 == 0) {
          OVar11 = OVar21 - iVar25;
          iVar17 = 0;
          local_5c = 0;
        }
        else {
          local_5c = 0;
          OVar11 = OVar22;
        }
      }
      uVar5 = poVar7[uVar18].y0;
      uVar3 = poVar7[uVar18].y1;
      OVar29 = uVar3 - uVar5;
      OVar27 = poVar31->h;
      uVar18 = OVar27 + uVar26;
      iVar16 = uVar26 - uVar5;
      if (uVar26 < uVar5) {
        iVar12 = uVar5 - uVar26;
        iVar16 = 0;
        OVar27 = OVar29;
        if (uVar18 < uVar3) {
          OVar27 = uVar18 - uVar5;
          iVar30 = OVar29 - OVar27;
        }
        else {
LAB_001f5ae0:
          iVar30 = 0 >> (bVar1 & 0x1f);
        }
      }
      else {
        iVar30 = uVar3 - uVar18;
        if (uVar3 < uVar18 || iVar30 == 0) {
          iVar12 = 0;
          OVar27 = OVar29 - iVar16;
          goto LAB_001f5ae0;
        }
        iVar12 = 0;
      }
      if (iVar25 < 0) {
        return 0;
      }
      if (iVar16 < 0) {
        return 0;
      }
      if (iVar17 < 0) {
        return 0;
      }
      if (iVar30 < 0) {
        return 0;
      }
      iVar16 = iVar16 * OVar21 + iVar25;
      uVar18 = iVar17 + iVar25;
      iVar25 = iVar30 * OVar21 - iVar25;
      iVar17 = OVar22 - OVar11;
      puVar10 = (uint *)(poVar31->data + (int)(iVar12 * OVar22 + local_5c));
      if (iVar19 == 4) {
        puVar20 = (ushort *)((long)p_data + (long)iVar16 * 2 * 2);
        if (OVar27 != 0) {
          OVar22 = 0;
          do {
            if (OVar11 != 0) {
              lVar15 = 0;
              lVar13 = 0;
              do {
                puVar10[lVar13] = *(uint *)(puVar20 + lVar13 * 2);
                lVar13 = lVar13 + 1;
                lVar15 = lVar15 + -4;
              } while (OVar11 != (OPJ_UINT32)lVar13);
              puVar20 = (ushort *)((long)puVar20 - lVar15);
              puVar10 = (uint *)((long)puVar10 - lVar15);
            }
            puVar10 = puVar10 + iVar17;
            puVar20 = puVar20 + (ulong)uVar18 * 2;
            OVar22 = OVar22 + 1;
          } while (OVar22 != OVar27);
        }
        p_data = (OPJ_BYTE *)(puVar20 + (long)iVar25 * 2);
      }
      else if (iVar19 == 2) {
        puVar20 = (ushort *)((long)p_data + (long)iVar16 * 2);
        if (poVar28->sgnd == 0) {
          if (OVar27 != 0) {
            OVar21 = 0;
            OVar22 = OVar11;
            do {
              for (; OVar22 != 0; OVar22 = OVar22 - 1) {
                uVar2 = *puVar20;
                puVar20 = puVar20 + 1;
                *puVar10 = (uint)uVar2;
                puVar10 = puVar10 + 1;
              }
              puVar10 = puVar10 + iVar17;
              puVar20 = puVar20 + uVar18;
              OVar21 = OVar21 + 1;
              OVar22 = OVar11;
            } while (OVar21 != OVar27);
          }
        }
        else if (OVar27 != 0) {
          OVar21 = 0;
          OVar22 = OVar11;
          do {
            for (; OVar22 != 0; OVar22 = OVar22 - 1) {
              uVar2 = *puVar20;
              puVar20 = puVar20 + 1;
              *puVar10 = (int)(short)uVar2;
              puVar10 = puVar10 + 1;
            }
            puVar10 = puVar10 + iVar17;
            puVar20 = puVar20 + uVar18;
            OVar21 = OVar21 + 1;
            OVar22 = OVar11;
          } while (OVar21 != OVar27);
        }
        p_data = (OPJ_BYTE *)(puVar20 + iVar25);
      }
      else if (iVar19 == 1) {
        pbVar14 = (byte *)((long)p_data + (long)iVar16);
        if (poVar28->sgnd == 0) {
          if (OVar27 != 0) {
            OVar21 = 0;
            OVar22 = OVar11;
            do {
              for (; OVar22 != 0; OVar22 = OVar22 - 1) {
                bVar1 = *pbVar14;
                pbVar14 = pbVar14 + 1;
                *puVar10 = (uint)bVar1;
                puVar10 = puVar10 + 1;
              }
              pbVar14 = pbVar14 + uVar18;
              puVar10 = puVar10 + iVar17;
              OVar21 = OVar21 + 1;
              OVar22 = OVar11;
            } while (OVar21 != OVar27);
          }
        }
        else if (OVar27 != 0) {
          OVar21 = 0;
          OVar22 = OVar11;
          do {
            for (; OVar22 != 0; OVar22 = OVar22 - 1) {
              bVar1 = *pbVar14;
              pbVar14 = pbVar14 + 1;
              *puVar10 = (int)(char)bVar1;
              puVar10 = puVar10 + 1;
            }
            pbVar14 = pbVar14 + uVar18;
            puVar10 = puVar10 + iVar17;
            OVar21 = OVar21 + 1;
            OVar22 = OVar11;
          } while (OVar21 != OVar27);
        }
        p_data = pbVar14 + iVar25;
      }
      poVar31 = poVar31 + 1;
      poVar28 = poVar28 + 1;
      poVar24 = poVar24 + 1;
      uVar8 = uVar8 + 1;
    } while (uVar8 < poVar6->numcomps);
  }
  return 1;
}

Assistant:

opj_bool j2k_update_image_data (opj_tcd_v2_t * p_tcd, OPJ_BYTE * p_data, opj_image_t* p_output_image)
{
	OPJ_UINT32 i,j,k = 0;
	OPJ_UINT32 l_width_src,l_height_src;
	OPJ_UINT32 l_width_dest,l_height_dest;
	OPJ_INT32 l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src;
	OPJ_INT32 l_start_offset_src, l_line_offset_src, l_end_offset_src ;
	OPJ_UINT32 l_start_x_dest , l_start_y_dest;
	OPJ_UINT32 l_x0_dest, l_y0_dest, l_x1_dest, l_y1_dest;
	OPJ_INT32 l_start_offset_dest, l_line_offset_dest;

	opj_image_comp_t * l_img_comp_src = 00;
	opj_image_comp_t * l_img_comp_dest = 00;

	opj_tcd_tilecomp_v2_t * l_tilec = 00;
	opj_image_t * l_image_src = 00;
	OPJ_UINT32 l_size_comp, l_remaining;
	OPJ_INT32 * l_dest_ptr;
	opj_tcd_resolution_v2_t* l_res= 00;

	l_tilec = p_tcd->tcd_image->tiles->comps;
	l_image_src = p_tcd->image;
	l_img_comp_src = l_image_src->comps;

	l_img_comp_dest = p_output_image->comps;

	for (i=0; i<l_image_src->numcomps; i++) {

		/* Allocate output component buffer if necessary */
		if (!l_img_comp_dest->data) {

			l_img_comp_dest->data = (OPJ_INT32*) opj_calloc(l_img_comp_dest->w * l_img_comp_dest->h, sizeof(OPJ_INT32));
			if (! l_img_comp_dest->data) {
				return OPJ_FALSE;
			}
		}

		/* Copy info from decoded comp image to output image */
		l_img_comp_dest->resno_decoded = l_img_comp_src->resno_decoded;

		/*-----*/
		/* Compute the precision of the output buffer */
		l_size_comp = l_img_comp_src->prec >> 3; /*(/ 8)*/
		l_remaining = l_img_comp_src->prec & 7;  /* (%8) */
		l_res = l_tilec->resolutions + l_img_comp_src->resno_decoded;

		if (l_remaining) {
			++l_size_comp;
		}

		if (l_size_comp == 3) {
			l_size_comp = 4;
		}
		/*-----*/

		/* Current tile component size*/
		/*if (i == 0) {
		fprintf(stdout, "SRC: l_res_x0=%d, l_res_x1=%d, l_res_y0=%d, l_res_y1=%d\n",
				l_res->x0, l_res->x1, l_res->y0, l_res->y1);
		}*/

		l_width_src = (l_res->x1 - l_res->x0);
		l_height_src = (l_res->y1 - l_res->y0);

		/* Border of the current output component*/
		l_x0_dest = int_ceildivpow2(l_img_comp_dest->x0, l_img_comp_dest->factor);
		l_y0_dest = int_ceildivpow2(l_img_comp_dest->y0, l_img_comp_dest->factor);
		l_x1_dest = l_x0_dest + l_img_comp_dest->w;
		l_y1_dest = l_y0_dest + l_img_comp_dest->h;

		/*if (i == 0) {
		fprintf(stdout, "DEST: l_x0_dest=%d, l_x1_dest=%d, l_y0_dest=%d, l_y1_dest=%d (%d)\n",
				l_x0_dest, l_x1_dest, l_y0_dest, l_y1_dest, l_img_comp_dest->factor );
		}*/

		/*-----*/
		/* Compute the area (l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src)
		 * of the input buffer (decoded tile component) which will be move
		 * in the output buffer. Compute the area of the output buffer (l_start_x_dest,
		 * l_start_y_dest, l_width_dest, l_height_dest)  which will be modified
		 * by this input area.
		 * */
		if ( l_x0_dest < l_res->x0 ) {
			l_start_x_dest = l_res->x0 - l_x0_dest;
			l_offset_x0_src = 0;

			if ( l_x1_dest >= l_res->x1 ) {
				l_width_dest = l_width_src;
				l_offset_x1_src = 0;
			}
			else {
				l_width_dest = l_x1_dest - l_res->x0 ;
				l_offset_x1_src = l_width_src - l_width_dest;
			}
		}
		else {
			l_start_x_dest = 0 ;
			l_offset_x0_src = l_x0_dest - l_res->x0;

			if ( l_x1_dest >= l_res->x1 ) {
				l_width_dest = l_width_src - l_offset_x0_src;
				l_offset_x1_src = 0;
			}
			else {
				l_width_dest = l_img_comp_dest->w ;
				l_offset_x1_src = l_res->x1 - l_x1_dest;
			}
		}

		if ( l_y0_dest < l_res->y0 ) {
			l_start_y_dest = l_res->y0 - l_y0_dest;
			l_offset_y0_src = 0;

			if ( l_y1_dest >= l_res->y1 ) {
				l_height_dest = l_height_src;
				l_offset_y1_src = 0;
			}
			else {
				l_height_dest = l_y1_dest - l_res->y0 ;
				l_offset_y1_src =  l_height_src - l_height_dest;
			}
		}
		else {
			l_start_y_dest = 0 ;
			l_offset_y0_src = l_y0_dest - l_res->y0;

			if ( l_y1_dest >= l_res->y1 ) {
				l_height_dest = l_height_src - l_offset_y0_src;
				l_offset_y1_src = 0;
			}
			else {
				l_height_dest = l_img_comp_dest->h ;
				l_offset_y1_src = l_res->y1 - l_y1_dest;
			}
		}

		if( (l_offset_x0_src < 0 ) || (l_offset_y0_src < 0 ) || (l_offset_x1_src < 0 ) || (l_offset_y1_src < 0 ) ){
			return OPJ_FALSE;
		}
		/*-----*/

		/* Compute the input buffer offset */
		l_start_offset_src = l_offset_x0_src + l_offset_y0_src * l_width_src;
		l_line_offset_src = l_offset_x1_src + l_offset_x0_src;
		l_end_offset_src = l_offset_y1_src * l_width_src - l_offset_x0_src;

		/* Compute the output buffer offset */
		l_start_offset_dest = l_start_x_dest + l_start_y_dest * l_img_comp_dest->w;
		l_line_offset_dest = l_img_comp_dest->w - l_width_dest;

		/* Move the output buffer to the first place where we will write*/
		l_dest_ptr = l_img_comp_dest->data + l_start_offset_dest;

		/*if (i == 0) {
			fprintf(stdout, "COMPO[%d]:\n",i);
			fprintf(stdout, "SRC: l_start_x_src=%d, l_start_y_src=%d, l_width_src=%d, l_height_src=%d\n"
					"\t tile offset:%d, %d, %d, %d\n"
					"\t buffer offset: %d; %d, %d\n",
					l_res->x0, l_res->y0, l_width_src, l_height_src,
					l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src,
					l_start_offset_src, l_line_offset_src, l_end_offset_src);

			fprintf(stdout, "DEST: l_start_x_dest=%d, l_start_y_dest=%d, l_width_dest=%d, l_height_dest=%d\n"
					"\t start offset: %d, line offset= %d\n",
					l_start_x_dest, l_start_y_dest, l_width_dest, l_height_dest, l_start_offset_dest, l_line_offset_dest);
		}*/


		switch (l_size_comp) {
			case 1:
				{
					OPJ_CHAR * l_src_ptr = (OPJ_CHAR*) p_data;
					l_src_ptr += l_start_offset_src; /* Move to the first place where we will read*/

					if (l_img_comp_src->sgnd) {
						for (j = 0 ; j < l_height_dest ; ++j) {
							for ( k = 0 ; k < l_width_dest ; ++k) {
								*(l_dest_ptr++) = (OPJ_INT32) (*(l_src_ptr++)); /* Copy only the data needed for the output image */
							}

							l_dest_ptr+= l_line_offset_dest; /* Move to the next place where we will write */
							l_src_ptr += l_line_offset_src ; /* Move to the next place where we will read */
						}
					}
					else {
						for ( j = 0 ; j < l_height_dest ; ++j ) {
							for ( k = 0 ; k < l_width_dest ; ++k) {
								*(l_dest_ptr++) = (OPJ_INT32) ((*(l_src_ptr++))&0xff);
							}

							l_dest_ptr+= l_line_offset_dest;
							l_src_ptr += l_line_offset_src;
						}
					}

					l_src_ptr += l_end_offset_src; /* Move to the end of this component-part of the input buffer */
					p_data = (OPJ_BYTE*) l_src_ptr; /* Keep the current position for the next component-part */
				}
				break;
			case 2:
				{
					OPJ_INT16 * l_src_ptr = (OPJ_INT16 *) p_data;
					l_src_ptr += l_start_offset_src;

					if (l_img_comp_src->sgnd) {
						for (j=0;j<l_height_dest;++j) {
							for (k=0;k<l_width_dest;++k) {
								*(l_dest_ptr++) = *(l_src_ptr++);
							}

							l_dest_ptr+= l_line_offset_dest;
							l_src_ptr += l_line_offset_src ;
						}
					}
					else {
						for (j=0;j<l_height_dest;++j) {
							for (k=0;k<l_width_dest;++k) {
								*(l_dest_ptr++) = (*(l_src_ptr++))&0xffff;
							}

							l_dest_ptr+= l_line_offset_dest;
							l_src_ptr += l_line_offset_src ;
						}
					}

					l_src_ptr += l_end_offset_src;
					p_data = (OPJ_BYTE*) l_src_ptr;
				}
				break;
			case 4:
				{
					OPJ_INT32 * l_src_ptr = (OPJ_INT32 *) p_data;
					l_src_ptr += l_start_offset_src;

					for (j=0;j<l_height_dest;++j) {
						for (k=0;k<l_width_dest;++k) {
							*(l_dest_ptr++) = (*(l_src_ptr++));
						}

						l_dest_ptr+= l_line_offset_dest;
						l_src_ptr += l_line_offset_src ;
					}

					l_src_ptr += l_end_offset_src;
					p_data = (OPJ_BYTE*) l_src_ptr;
				}
				break;
		}

		++l_img_comp_dest;
		++l_img_comp_src;
		++l_tilec;
	}

	return OPJ_TRUE;
}